

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::draw_string
          (Fl_Text_Display *this,int style,int X,int Y,int toX,char *string,int nChars)

{
  Fl_Color FVar1;
  Fl_Color FVar2;
  int iVar3;
  int iVar4;
  Style_Table_Entry *pSVar5;
  Fl_Text_Display *pFVar6;
  Fl_Color local_60;
  int local_44;
  Fl_Color local_40;
  int si;
  Fl_Color background;
  Fl_Color foreground;
  int fsize;
  Fl_Font font;
  Style_Table_Entry *styleRec;
  char *string_local;
  int toX_local;
  int Y_local;
  int X_local;
  int style_local;
  Fl_Text_Display *this_local;
  
  if ((style & 0x100U) == 0) {
    foreground = textfont(this);
    background = textsize(this);
    if ((style & 0xffU) == 0) {
      if ((style & 0x400U) == 0) {
        if ((style & 0x800U) == 0) {
          si = textcolor(this);
          local_40 = Fl_Widget::color((Fl_Widget *)this);
        }
        else {
          pFVar6 = (Fl_Text_Display *)Fl::focus();
          if (pFVar6 == this) {
            FVar1 = Fl_Widget::color((Fl_Widget *)this);
            FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
            local_40 = fl_color_average(FVar1,FVar2,0.5);
          }
          else {
            FVar1 = Fl_Widget::color((Fl_Widget *)this);
            FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
            local_40 = fl_color_average(FVar1,FVar2,0.6);
          }
          FVar1 = textcolor(this);
          si = fl_contrast(FVar1,local_40);
        }
      }
      else {
        pFVar6 = (Fl_Text_Display *)Fl::focus();
        if (pFVar6 == this) {
          local_40 = Fl_Widget::selection_color((Fl_Widget *)this);
        }
        else {
          FVar1 = Fl_Widget::color((Fl_Widget *)this);
          FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
          local_40 = fl_color_average(FVar1,FVar2,0.4);
        }
        FVar1 = textcolor(this);
        si = fl_contrast(FVar1,local_40);
      }
    }
    else {
      local_44 = (style & 0xffU) - 0x41;
      if (local_44 < 0) {
        local_44 = 0;
      }
      else if (this->mNStyles <= local_44) {
        local_44 = this->mNStyles + -1;
      }
      pSVar5 = this->mStyleTable + local_44;
      foreground = pSVar5->font;
      background = pSVar5->size;
      if ((style & 0x400U) == 0) {
        if ((style & 0x800U) == 0) {
          local_40 = Fl_Widget::color((Fl_Widget *)this);
        }
        else {
          pFVar6 = (Fl_Text_Display *)Fl::focus();
          if (pFVar6 == this) {
            FVar1 = Fl_Widget::color((Fl_Widget *)this);
            FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
            local_40 = fl_color_average(FVar1,FVar2,0.5);
          }
          else {
            FVar1 = Fl_Widget::color((Fl_Widget *)this);
            FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
            local_40 = fl_color_average(FVar1,FVar2,0.6);
          }
        }
      }
      else {
        pFVar6 = (Fl_Text_Display *)Fl::focus();
        if (pFVar6 == this) {
          local_40 = Fl_Widget::selection_color((Fl_Widget *)this);
        }
        else {
          FVar1 = Fl_Widget::color((Fl_Widget *)this);
          FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
          local_40 = fl_color_average(FVar1,FVar2,0.4);
        }
      }
      if ((style & 0x400U) == 0) {
        local_60 = pSVar5->color;
      }
      else {
        local_60 = fl_contrast(pSVar5->color,local_40);
      }
      si = local_60;
    }
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar3 == 0) {
      si = fl_inactive(si);
      local_40 = fl_inactive(local_40);
    }
    if ((style & 0x2000U) == 0) {
      fl_color(local_40);
      fl_rectf(X,Y,toX - X,this->mMaxsize);
    }
    if ((style & 0x1000U) == 0) {
      fl_color(si);
      fl_font(foreground,background);
      iVar3 = this->mMaxsize;
      iVar4 = fl_descent();
      fl_draw(string,nChars,X,(Y + iVar3) - iVar4);
    }
  }
  else if ((style & 0x2000U) == 0) {
    clear_rect(this,style,X,Y,toX - X,this->mMaxsize);
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_string(int style,
                                  int X, int Y, int toX,
                                  const char *string, int nChars) const {
  IS_UTF8_ALIGNED(string)

  const Style_Table_Entry * styleRec;

  /* Draw blank area rather than text, if that was the request */
  if ( style & FILL_MASK ) {
    if (style & TEXT_ONLY_MASK) return;
    clear_rect( style, X, Y, toX - X, mMaxsize );
    return;
  }
  /* Set font, color, and gc depending on style.  For normal text, GCs
   for normal drawing, or drawing within a Fl_Text_Selection or highlight are
   pre-allocated and pre-configured.  For syntax highlighting, GCs are
   configured here, on the fly. */

  Fl_Font font = textfont();
  int fsize = textsize();
  Fl_Color foreground;
  Fl_Color background;

  if ( style & STYLE_LOOKUP_MASK ) {
    int si = (style & STYLE_LOOKUP_MASK) - 'A';
    if (si < 0) si = 0;
    else if (si >= mNStyles) si = mNStyles - 1;

    styleRec = mStyleTable + si;
    font  = styleRec->font;
    fsize = styleRec->size;

    if (style & PRIMARY_MASK) {
      if (Fl::focus() == (Fl_Widget*)this) {
#ifdef __APPLE__
	if (Fl::compose_state) background = color();// Mac OS: underline marked text
	else 
#endif
	background = selection_color();
	}
      else background = fl_color_average(color(), selection_color(), 0.4f);
    } else if (style & HIGHLIGHT_MASK) {
      if (Fl::focus() == (Fl_Widget*)this) background = fl_color_average(color(), selection_color(), 0.5f);
      else background = fl_color_average(color(), selection_color(), 0.6f);
    } else background = color();
    foreground = (style & PRIMARY_MASK) ? fl_contrast(styleRec->color, background) : styleRec->color;
  } else if (style & PRIMARY_MASK) {
    if (Fl::focus() == (Fl_Widget*)this) background = selection_color();
    else background = fl_color_average(color(), selection_color(), 0.4f);
    foreground = fl_contrast(textcolor(), background);
  } else if (style & HIGHLIGHT_MASK) {
    if (Fl::focus() == (Fl_Widget*)this) background = fl_color_average(color(), selection_color(), 0.5f);
    else background = fl_color_average(color(), selection_color(), 0.6f);
    foreground = fl_contrast(textcolor(), background);
  } else {
    foreground = textcolor();
    background = color();
  }

  if ( !active_r() ) {
    foreground = fl_inactive(foreground);
    background = fl_inactive(background);
  }

  if (!(style & TEXT_ONLY_MASK)) {
    fl_color( background );
    fl_rectf( X, Y, toX - X, mMaxsize );
  }
  if (!(style & BG_ONLY_MASK)) {
    fl_color( foreground );
    fl_font( font, fsize );
#if !(defined(__APPLE__) || defined(WIN32)) && USE_XFT
    // makes sure antialiased ÄÖÜ do not leak on line above
    fl_push_clip(X, Y, toX - X, mMaxsize);
#endif
    fl_draw( string, nChars, X, Y + mMaxsize - fl_descent());
#ifdef __APPLE__ // Mac OS: underline marked (= selected + Fl::compose_state != 0) text
    if (Fl::compose_state && (style & PRIMARY_MASK)) {
      fl_color( fl_color_average(foreground, background, 0.6) );
      fl_line(X, Y + mMaxsize - 1, X + fl_width(string, nChars), Y + mMaxsize - 1);
    }
#endif
#if !(defined(__APPLE__) || defined(WIN32)) && USE_XFT
    fl_pop_clip();
#endif
  }

  // CET - FIXME
  /* If any space around the character remains unfilled (due to use of
   different sized fonts for highlighting), fill in above or below
   to erase previously drawn characters */
  /*
   if (fs->ascent < mAscent)
   clear_rect( style, X, Y, toX - X, mAscent - fs->ascent);
   if (fs->descent < mDescent)
   clear_rect( style, X, Y + mAscent + fs->descent, toX - x,
   mDescent - fs->descent);
   */
  /* Underline if style is secondary Fl_Text_Selection */

  /*
   if (style & SECONDARY_MASK)
   XDrawLine(XtDisplay(mW), XtWindow(mW), gc, x,
   y + mAscent, toX - 1, Y + fs->ascent);
   */
}